

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

Bytes __thiscall Omega_h::mark_fan_preimage(Omega_h *this,LOs *a2b)

{
  size_type *psVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  void *pvVar4;
  ulong uVar5;
  ulong **__dest;
  long *plVar6;
  undefined8 *puVar7;
  long lVar8;
  ulong *puVar9;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar10;
  int iVar11;
  Alloc *pAVar12;
  size_t sVar13;
  Alloc *this_00;
  Bytes BVar14;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> out;
  size_type __dnew;
  type f;
  ScopedTimer local_f9;
  string local_f8;
  Write<signed_char> local_d8;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  Alloc *local_a8;
  void *pvStack_a0;
  Alloc *local_98;
  void *pvStack_90;
  Write<signed_char> local_80;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  ulong **local_50;
  ulong *local_48;
  ulong *local_40 [2];
  
  pAVar12 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar12 & 1) == 0) {
    uVar5 = pAVar12->size;
  }
  else {
    uVar5 = (ulong)pAVar12 >> 3;
  }
  if ((int)(uVar5 >> 2) < 1) {
    fail("assertion %s failed at %s +%d\n","a2b.size() >= 1",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
         ,0x11b);
  }
  if (((ulong)pAVar12 & 1) == 0) {
    sVar13 = pAVar12->size;
  }
  else {
    sVar13 = (ulong)pAVar12 >> 3;
  }
  paVar3 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
  Write<signed_char>::Write(&local_d8,(int)(sVar13 >> 2) + -1,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  local_a8 = local_d8.shared_alloc_.alloc;
  if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 && local_d8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pvStack_a0 = local_d8.shared_alloc_.direct_ptr;
  local_98 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98 = (Alloc *)(local_98->size * 8 + 1);
    }
    else {
      local_98->use_count = local_98->use_count + 1;
    }
  }
  pvStack_90 = (a2b->write_).shared_alloc_.direct_ptr;
  if (((ulong)local_d8.shared_alloc_.alloc & 1) == 0) {
    iVar11 = (int)(local_d8.shared_alloc_.alloc)->size;
  }
  else {
    iVar11 = (int)((ulong)local_d8.shared_alloc_.alloc >> 3);
  }
  local_50 = local_40;
  local_c8 = (ulong *)0x5d;
  __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_c8);
  puVar9 = local_c8;
  local_40[0] = local_c8;
  local_50 = __dest;
  memcpy(__dest,
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
         ,0x5d);
  local_48 = puVar9;
  *(undefined1 *)((long)__dest + (long)puVar9) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar9) {
    local_60 = *puVar9;
    lStack_58 = plVar6[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar9;
    local_70 = (ulong *)*plVar6;
  }
  local_68 = plVar6[1];
  *plVar6 = (long)puVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct((ulong)&local_c8,'\x02');
  *(undefined2 *)local_c8 = 0x3438;
  uVar5 = 0xf;
  if (local_70 != &local_60) {
    uVar5 = local_60;
  }
  if (uVar5 < (ulong)(local_c0 + local_68)) {
    uVar5 = 0xf;
    if (local_c8 != local_b8) {
      uVar5 = local_b8[0];
    }
    if ((ulong)(local_c0 + local_68) <= uVar5) {
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_70);
      goto LAB_002fdbf4;
    }
  }
  puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_c8);
LAB_002fdbf4:
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_f8.field_2._M_allocated_capacity = *psVar1;
    local_f8.field_2._8_8_ = puVar7[3];
    local_f8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar1;
    local_f8._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_f8._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  begin_code("parallel_for",local_f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,(long)local_40[0] + 1);
  }
  pvVar4 = pvStack_90;
  pvVar10 = pvStack_a0;
  if (0 < iVar11) {
    pAVar12 = local_a8;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      local_a8->use_count = local_a8->use_count + -1;
      pAVar12 = (Alloc *)(local_a8->size * 8 + 1);
    }
    local_a8 = (Alloc *)0x0;
    pvStack_a0 = (void *)0x0;
    this_00 = local_98;
    if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
      local_98->use_count = local_98->use_count + -1;
      this_00 = (Alloc *)(local_98->size * 8 + 1);
    }
    local_98 = (Alloc *)0x0;
    pvStack_90 = (void *)0x0;
    entering_parallel = '\0';
    lVar8 = 0;
    do {
      *(bool *)((long)pvVar10 + lVar8) =
           *(int *)((long)pvVar4 + lVar8 * 4) != *(int *)((long)pvVar4 + lVar8 * 4 + 4);
      lVar8 = lVar8 + 1;
    } while (iVar11 != (int)lVar8);
    if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
      piVar2 = &this_00->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(this_00);
        operator_delete(this_00,0x48);
      }
    }
    if (((ulong)pAVar12 & 7) == 0 && pAVar12 != (Alloc *)0x0) {
      piVar2 = &pAVar12->use_count;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        Alloc::~Alloc(pAVar12);
        operator_delete(pAVar12,0x48);
      }
    }
  }
  ScopedTimer::~ScopedTimer(&local_f9);
  local_80.shared_alloc_.alloc = local_d8.shared_alloc_.alloc;
  local_80.shared_alloc_.direct_ptr = local_d8.shared_alloc_.direct_ptr;
  if ((((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
       local_d8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + -1;
    local_80.shared_alloc_.alloc = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_d8.shared_alloc_.alloc = (Alloc *)0x0;
  local_d8.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)this,&local_80);
  pAVar12 = local_80.shared_alloc_.alloc;
  pvVar10 = extraout_RDX;
  if (((ulong)local_80.shared_alloc_.alloc & 7) == 0 && local_80.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_80.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_80.shared_alloc_.alloc);
      operator_delete(pAVar12,0x48);
      pvVar10 = extraout_RDX_00;
    }
  }
  pAVar12 = local_98;
  if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
    piVar2 = &local_98->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_98);
      operator_delete(pAVar12,0x48);
      pvVar10 = extraout_RDX_01;
    }
  }
  pAVar12 = local_a8;
  if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
    piVar2 = &local_a8->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_a8);
      operator_delete(pAVar12,0x48);
      pvVar10 = extraout_RDX_02;
    }
  }
  pAVar12 = local_d8.shared_alloc_.alloc;
  if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 && local_d8.shared_alloc_.alloc != (Alloc *)0x0
     ) {
    piVar2 = &(local_d8.shared_alloc_.alloc)->use_count;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      Alloc::~Alloc(local_d8.shared_alloc_.alloc);
      operator_delete(pAVar12,0x48);
      pvVar10 = extraout_RDX_03;
    }
  }
  BVar14.write_.shared_alloc_.direct_ptr = pvVar10;
  BVar14.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Bytes)BVar14.write_.shared_alloc_;
}

Assistant:

Bytes mark_fan_preimage(LOs a2b) {
  OMEGA_H_CHECK(a2b.size() >= 1);
  auto out = Write<Byte>(a2b.size() - 1);
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = (a2b[i] != a2b[i + 1]); };
  parallel_for(out.size(), f);
  return out;
}